

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_privkey.cc
# Opt level: O0

int SSL_CTX_use_PrivateKey(SSL_CTX *ctx,EVP_PKEY *pkey)

{
  pointer pCVar1;
  pointer cred;
  EVP_PKEY *pkey_local;
  SSL_CTX *ctx_local;
  
  if (pkey == (EVP_PKEY *)0x0) {
    ERR_put_error(0x10,0,0x43,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_privkey.cc"
                  ,0x196);
    ctx_local._4_4_ = 0;
  }
  else {
    pCVar1 = std::unique_ptr<bssl::CERT,_bssl::internal::Deleter>::operator->
                       ((unique_ptr<bssl::CERT,_bssl::internal::Deleter> *)&ctx->read_ahead);
    cred = std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>::get
                     (&pCVar1->legacy_credential);
    ctx_local._4_4_ = SSL_CREDENTIAL_set1_private_key(cred,(EVP_PKEY *)pkey);
  }
  return ctx_local._4_4_;
}

Assistant:

int SSL_CTX_use_PrivateKey(SSL_CTX *ctx, EVP_PKEY *pkey) {
  if (pkey == NULL) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_PASSED_NULL_PARAMETER);
    return 0;
  }

  return SSL_CREDENTIAL_set1_private_key(ctx->cert->legacy_credential.get(),
                                         pkey);
}